

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall SummedArea_Rect_Test::~SummedArea_Rect_Test(SummedArea_Rect_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SummedArea, Rect) {
    Array2D<Float> v(8, 4);

    for (int y = 0; y < v.ySize(); ++y)
        for (int x = 0; x < v.xSize(); ++x)
            v(x, y) = x + y;

    SummedAreaTable sat(v);

    // All boxes that line up with boundaries exactly
    for (int y0 = 0; y0 < v.ySize(); ++y0)
        for (int x0 = 0; x0 < v.xSize(); ++x0)
            for (int y1 = y0; y1 < v.ySize(); ++y1)
                for (int x1 = x0; x1 < v.xSize(); ++x1) {
                    Float mySum = 0;
                    for (int y = y0; y < y1; ++y)
                        for (int x = x0; x < x1; ++x)
                            mySum += v(x, y);

                    Bounds2f b(Point2f(Float(x0) / v.xSize(), Float(y0) / v.ySize()),
                               Point2f(Float(x1) / v.xSize(), Float(y1) / v.ySize()));
                    EXPECT_EQ(mySum / (v.xSize() * v.ySize()), sat.Sum(b));
                }
}